

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_data_collection_scanner.cpp
# Opt level: O2

void __thiscall
duckdb::RowDataCollectionScanner::RowDataCollectionScanner
          (RowDataCollectionScanner *this,RowDataCollection *rows_p,RowDataCollection *heap_p,
          RowLayout *layout_p,bool external_p,idx_t block_idx,bool flush_p)

{
  byte bVar1;
  long lVar2;
  pointer pRVar3;
  unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true> *this_00;
  unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true> *this_01;
  idx_t iVar4;
  LogicalType local_48;
  
  this->rows = rows_p;
  this->heap = heap_p;
  RowLayout::RowLayout(&this->layout,layout_p);
  ScanState::ScanState(&this->read_state,this);
  this->total_count = this->rows->count;
  this->total_scanned = 0;
  LogicalType::LogicalType(&local_48,POINTER);
  Vector::Vector(&this->addresses,&local_48,0x800);
  LogicalType::~LogicalType(&local_48);
  this->external = external_p;
  this->flush = flush_p;
  bVar1 = false;
  if ((external_p) && (bVar1 = false, (this->layout).all_constant == false)) {
    bVar1 = this->heap->keep_pinned ^ 1;
  }
  this->unswizzling = (bool)bVar1;
  (this->read_state).block_idx = block_idx;
  (this->read_state).entry_idx = 0;
  this_00 = (this->rows->blocks).
            super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = NumericCastImpl<long,_unsigned_long,_false>::Convert(block_idx);
  this_01 = this_00 + lVar2;
  iVar4 = 0;
  for (lVar2 = lVar2 << 3; lVar2 != 0; lVar2 = lVar2 + -8) {
    pRVar3 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->(this_00);
    iVar4 = iVar4 + pRVar3->count;
    this_00 = this_00 + 1;
  }
  this->total_scanned = iVar4;
  pRVar3 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
           operator->(this_01);
  this->total_count = iVar4 + pRVar3->count;
  return;
}

Assistant:

RowDataCollectionScanner::RowDataCollectionScanner(RowDataCollection &rows_p, RowDataCollection &heap_p,
                                                   const RowLayout &layout_p, bool external_p, idx_t block_idx,
                                                   bool flush_p)
    : rows(rows_p), heap(heap_p), layout(layout_p), read_state(*this), total_count(rows.count), total_scanned(0),
      external(external_p), flush(flush_p), unswizzling(!layout.AllConstant() && external && !heap.keep_pinned) {

	if (unswizzling) {
		D_ASSERT(rows.blocks.size() == heap.blocks.size());
	}

	D_ASSERT(block_idx < rows.blocks.size());
	read_state.block_idx = block_idx;
	read_state.entry_idx = 0;

	//	Pretend that we have scanned up to the start block
	//	and will stop at the end
	auto begin = rows.blocks.begin();
	auto end = begin + NumericCast<int64_t>(block_idx);
	total_scanned =
	    std::accumulate(begin, end, idx_t(0), [&](idx_t c, const unique_ptr<RowDataBlock> &b) { return c + b->count; });
	total_count = total_scanned + (*end)->count;

	ValidateUnscannedBlock();
}